

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteFixed64Array
               (uint64_t *a,int n,CodedOutputStream *output)

{
  CodedOutputStream *output_local;
  int n_local;
  uint64_t *a_local;
  
  WriteArray<unsigned_long>(a,n,output);
  return;
}

Assistant:

void WireFormatLite::WriteFixed64Array(const uint64_t* a, int n,
                                       io::CodedOutputStream* output) {
  WriteArray<uint64_t>(a, n, output);
}